

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

size_t google::protobuf::internal::WireFormat::FieldDataOnlyByteSize
                 (FieldDescriptor *field,Message *message)

{
  FieldDescriptor *field_00;
  bool bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  Type TVar5;
  int32 iVar6;
  undefined4 extraout_var;
  MapFieldBase *this;
  Descriptor *pDVar7;
  size_t sVar8;
  size_t sVar9;
  string *value;
  long *plVar10;
  ulong uVar11;
  long lVar12;
  int64 iVar13;
  MessageLite *pMVar14;
  long *plVar15;
  size_t sVar16;
  int j;
  ulong uVar17;
  MapIterator iter;
  MapIterator end;
  
  iVar3 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])(message);
  plVar15 = (long *)CONCAT44(extraout_var,iVar3);
  bVar1 = FieldDescriptor::is_map(field);
  if (bVar1) {
    this = (MapFieldBase *)(**(code **)(*plVar15 + 0x2d8))(plVar15,message,field);
    bVar1 = MapFieldBase::IsMapValid(this);
    if (bVar1) {
      MapIterator::MapIterator(&iter,message,field);
      MapIterator::MapIterator(&end,message,field);
      pDVar7 = FieldDescriptor::message_type(field);
      field_00 = *(FieldDescriptor **)(pDVar7 + 0x30);
      pDVar7 = FieldDescriptor::message_type(field);
      lVar12 = *(long *)(pDVar7 + 0x30);
      (*this->_vptr_MapFieldBase[6])(this,&iter);
      (*this->_vptr_MapFieldBase[7])(this,&end);
      sVar16 = 0;
      while (iVar3 = (*(iter.map_)->_vptr_MapFieldBase[5])(iter.map_,&iter,&end),
            (char)iVar3 == '\0') {
        sVar8 = MapKeyDataOnlyByteSize(field_00,&iter.key_);
        sVar9 = MapValueRefDataOnlyByteSize((FieldDescriptor *)(lVar12 + 0xa8),&iter.value_);
        uVar4 = (int)sVar9 + (int)sVar8 + 2U | 1;
        iVar3 = 0x1f;
        if (uVar4 != 0) {
          for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        sVar16 = sVar16 + sVar9 + sVar8 + 2 + (ulong)(iVar3 * 9 + 0x49U >> 6);
        (*(iter.map_)->_vptr_MapFieldBase[0xf])(iter.map_,&iter);
      }
      MapIterator::~MapIterator(&end);
      MapIterator::~MapIterator(&iter);
      return sVar16;
    }
  }
  if (*(int *)(field + 0x4c) == 3) {
    uVar4 = (**(code **)(*plVar15 + 0x30))(plVar15,message,field);
    sVar16 = (size_t)uVar4;
  }
  else if (*(char *)(*(long *)(*(long *)(field + 0x58) + 0x20) + 0x6b) == '\0') {
    bVar2 = (**(code **)(*plVar15 + 0x28))(plVar15,message,field);
    sVar16 = (size_t)bVar2;
  }
  else {
    sVar16 = 1;
  }
  TVar5 = FieldDescriptor::type(field);
  sVar8 = sVar16;
  switch(TVar5) {
  case TYPE_DOUBLE:
  case TYPE_FIXED64:
  case TYPE_SFIXED64:
    sVar8 = sVar16 << 3;
    break;
  case TYPE_FLOAT:
  case TYPE_FIXED32:
  case TYPE_SFIXED32:
    sVar8 = sVar16 << 2;
    break;
  case TYPE_INT64:
    if (*(int *)(field + 0x4c) == 3) {
      sVar8 = 0;
      for (uVar17 = 0; sVar16 != uVar17; uVar17 = uVar17 + 1) {
        uVar11 = (**(code **)(*plVar15 + 0x158))(plVar15,message,field,uVar17 & 0xffffffff);
        lVar12 = 0x3f;
        if ((uVar11 | 1) != 0) {
          for (; (uVar11 | 1) >> lVar12 == 0; lVar12 = lVar12 + -1) {
          }
        }
        sVar8 = sVar8 + ((int)lVar12 * 9 + 0x49U >> 6);
      }
      return sVar8;
    }
    uVar17 = (**(code **)(*plVar15 + 0x90))(plVar15,message,field);
    goto LAB_0060df0c;
  case TYPE_UINT64:
    if (*(int *)(field + 0x4c) == 3) {
      sVar8 = 0;
      for (uVar17 = 0; sVar16 != uVar17; uVar17 = uVar17 + 1) {
        uVar11 = (**(code **)(*plVar15 + 0x168))(plVar15,message,field,uVar17 & 0xffffffff);
        lVar12 = 0x3f;
        if ((uVar11 | 1) != 0) {
          for (; (uVar11 | 1) >> lVar12 == 0; lVar12 = lVar12 + -1) {
          }
        }
        sVar8 = sVar8 + ((int)lVar12 * 9 + 0x49U >> 6);
      }
      return sVar8;
    }
    uVar17 = (**(code **)(*plVar15 + 0xa0))(plVar15,message,field);
LAB_0060df0c:
    lVar12 = 0x3f;
    if ((uVar17 | 1) != 0) {
      for (; (uVar17 | 1) >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    iVar3 = (int)lVar12;
LAB_0060df14:
    sVar8 = (size_t)(iVar3 * 9 + 0x49U >> 6);
    break;
  case TYPE_INT32:
    if (*(int *)(field + 0x4c) != 3) {
      iVar6 = (**(code **)(*plVar15 + 0x88))(plVar15,message,field);
LAB_0060dee6:
      sVar16 = io::CodedOutputStream::VarintSize32SignExtended(iVar6);
      return sVar16;
    }
    sVar8 = 0;
    for (uVar17 = 0; sVar16 != uVar17; uVar17 = uVar17 + 1) {
      iVar6 = (**(code **)(*plVar15 + 0x150))(plVar15,message,field,uVar17 & 0xffffffff);
      sVar9 = io::CodedOutputStream::VarintSize32SignExtended(iVar6);
      sVar8 = sVar8 + sVar9;
    }
    break;
  case TYPE_BOOL:
    break;
  case TYPE_STRING:
  case TYPE_BYTES:
    sVar8 = 0;
    for (uVar17 = 0; sVar16 != uVar17; uVar17 = uVar17 + 1) {
      iter.iter_ = &iter.key_;
      iter.map_ = (MapFieldBase *)0x0;
      iter.key_.val_.bool_value_ = false;
      if (*(int *)(field + 0x4c) == 3) {
        value = (string *)
                (**(code **)(*plVar15 + 0x1a8))(plVar15,message,field,uVar17 & 0xffffffff,&iter);
      }
      else {
        value = (string *)(**(code **)(*plVar15 + 0xe0))(plVar15,message,field,&iter);
      }
      sVar9 = WireFormatLite::StringSize(value);
      sVar8 = sVar8 + sVar9;
      std::__cxx11::string::~string((string *)&iter);
    }
    break;
  case TYPE_GROUP:
    if (*(int *)(field + 0x4c) != 3) {
      plVar15 = (long *)(**(code **)(*plVar15 + 0xd8))(plVar15,message,field,0);
      sVar16 = (**(code **)(*plVar15 + 0x60))(plVar15);
      return sVar16;
    }
    sVar8 = 0;
    for (uVar17 = 0; sVar16 != uVar17; uVar17 = uVar17 + 1) {
      plVar10 = (long *)(**(code **)(*plVar15 + 0x1a0))(plVar15,message,field,uVar17 & 0xffffffff);
      lVar12 = (**(code **)(*plVar10 + 0x60))(plVar10);
      sVar8 = sVar8 + lVar12;
    }
    break;
  case TYPE_MESSAGE:
    if (*(int *)(field + 0x4c) != 3) {
      pMVar14 = (MessageLite *)(**(code **)(*plVar15 + 0xd8))(plVar15,message,field,0);
      sVar16 = WireFormatLite::MessageSize(pMVar14);
      return sVar16;
    }
    sVar8 = 0;
    for (uVar17 = 0; sVar16 != uVar17; uVar17 = uVar17 + 1) {
      pMVar14 = (MessageLite *)
                (**(code **)(*plVar15 + 0x1a0))(plVar15,message,field,uVar17 & 0xffffffff);
      sVar9 = WireFormatLite::MessageSize(pMVar14);
      sVar8 = sVar8 + sVar9;
    }
    break;
  case TYPE_UINT32:
    if (*(int *)(field + 0x4c) == 3) {
      sVar8 = 0;
      for (uVar17 = 0; sVar16 != uVar17; uVar17 = uVar17 + 1) {
        uVar4 = (**(code **)(*plVar15 + 0x160))(plVar15,message,field,uVar17 & 0xffffffff);
        iVar3 = 0x1f;
        if ((uVar4 | 1) != 0) {
          for (; (uVar4 | 1) >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        sVar8 = sVar8 + (iVar3 * 9 + 0x49U >> 6);
      }
      return sVar8;
    }
    uVar4 = (**(code **)(*plVar15 + 0x98))(plVar15,message,field);
    iVar3 = 0x1f;
    if ((uVar4 | 1) != 0) {
      for (; (uVar4 | 1) >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    goto LAB_0060df14;
  case TYPE_ENUM:
    if (*(int *)(field + 0x4c) != 3) {
      lVar12 = (**(code **)(*plVar15 + 200))(plVar15,message,field);
      iVar6 = *(int32 *)(lVar12 + 0x10);
      goto LAB_0060dee6;
    }
    sVar8 = 0;
    for (uVar17 = 0; sVar16 != uVar17; uVar17 = uVar17 + 1) {
      lVar12 = (**(code **)(*plVar15 + 400))(plVar15,message,field,uVar17 & 0xffffffff);
      sVar9 = io::CodedOutputStream::VarintSize32SignExtended(*(int32 *)(lVar12 + 0x10));
      sVar8 = sVar8 + sVar9;
    }
    break;
  case TYPE_SINT32:
    if (*(int *)(field + 0x4c) != 3) {
      iVar6 = (**(code **)(*plVar15 + 0x88))(plVar15,message,field);
      sVar16 = WireFormatLite::SInt32Size(iVar6);
      return sVar16;
    }
    sVar8 = 0;
    for (uVar17 = 0; sVar16 != uVar17; uVar17 = uVar17 + 1) {
      iVar6 = (**(code **)(*plVar15 + 0x150))(plVar15,message,field,uVar17 & 0xffffffff);
      sVar9 = WireFormatLite::SInt32Size(iVar6);
      sVar8 = sVar8 + sVar9;
    }
    break;
  case MAX_TYPE:
    if (*(int *)(field + 0x4c) != 3) {
      iVar13 = (**(code **)(*plVar15 + 0x90))(plVar15,message,field);
      sVar16 = WireFormatLite::SInt64Size(iVar13);
      return sVar16;
    }
    sVar8 = 0;
    for (uVar17 = 0; sVar16 != uVar17; uVar17 = uVar17 + 1) {
      iVar13 = (**(code **)(*plVar15 + 0x158))(plVar15,message,field,uVar17 & 0xffffffff);
      sVar9 = WireFormatLite::SInt64Size(iVar13);
      sVar8 = sVar8 + sVar9;
    }
    break;
  default:
    sVar8 = 0;
  }
  return sVar8;
}

Assistant:

size_t WireFormat::FieldDataOnlyByteSize(
    const FieldDescriptor* field,
    const Message& message) {
  const Reflection* message_reflection = message.GetReflection();

  size_t data_size = 0;

  if (field->is_map()) {
    MapFieldBase* map_field =
        message_reflection->MapData(const_cast<Message*>(&message), field);
    if (map_field->IsMapValid()) {
      MapIterator iter(const_cast<Message*>(&message), field);
      MapIterator end(const_cast<Message*>(&message), field);
      const FieldDescriptor* key_field = field->message_type()->field(0);
      const FieldDescriptor* value_field = field->message_type()->field(1);
      for (map_field->MapBegin(&iter), map_field->MapEnd(&end); iter != end;
           ++iter) {
        size_t size = kMapEntryTagByteSize;
        size += MapKeyDataOnlyByteSize(key_field, iter.GetKey());
        size += MapValueRefDataOnlyByteSize(value_field, iter.GetValueRef());
        data_size += WireFormatLite::LengthDelimitedSize(size);
      }
      return data_size;
    }
  }

  size_t count = 0;
  if (field->is_repeated()) {
    count =
        internal::FromIntSize(message_reflection->FieldSize(message, field));
  } else if (field->containing_type()->options().map_entry()) {
    // Map entry fields always need to be serialized.
    count = 1;
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  switch (field->type()) {
#define HANDLE_TYPE(TYPE, TYPE_METHOD, CPPTYPE_METHOD)                     \
    case FieldDescriptor::TYPE_##TYPE:                                     \
      if (field->is_repeated()) {                                          \
        for (int j = 0; j < count; j++) {                                  \
          data_size += WireFormatLite::TYPE_METHOD##Size(                  \
            message_reflection->GetRepeated##CPPTYPE_METHOD(               \
              message, field, j));                                         \
        }                                                                  \
      } else {                                                             \
        data_size += WireFormatLite::TYPE_METHOD##Size(                    \
          message_reflection->Get##CPPTYPE_METHOD(message, field));        \
      }                                                                    \
      break;

#define HANDLE_FIXED_TYPE(TYPE, TYPE_METHOD)                               \
    case FieldDescriptor::TYPE_##TYPE:                                     \
      data_size += count * WireFormatLite::k##TYPE_METHOD##Size;           \
      break;

    HANDLE_TYPE( INT32,  Int32,  Int32)
    HANDLE_TYPE( INT64,  Int64,  Int64)
    HANDLE_TYPE(SINT32, SInt32,  Int32)
    HANDLE_TYPE(SINT64, SInt64,  Int64)
    HANDLE_TYPE(UINT32, UInt32, UInt32)
    HANDLE_TYPE(UINT64, UInt64, UInt64)

    HANDLE_FIXED_TYPE( FIXED32,  Fixed32)
    HANDLE_FIXED_TYPE( FIXED64,  Fixed64)
    HANDLE_FIXED_TYPE(SFIXED32, SFixed32)
    HANDLE_FIXED_TYPE(SFIXED64, SFixed64)

    HANDLE_FIXED_TYPE(FLOAT , Float )
    HANDLE_FIXED_TYPE(DOUBLE, Double)

    HANDLE_FIXED_TYPE(BOOL, Bool)

    HANDLE_TYPE(GROUP  , Group  , Message)
    HANDLE_TYPE(MESSAGE, Message, Message)
#undef HANDLE_TYPE
#undef HANDLE_FIXED_TYPE

    case FieldDescriptor::TYPE_ENUM: {
      if (field->is_repeated()) {
        for (int j = 0; j < count; j++) {
          data_size += WireFormatLite::EnumSize(
            message_reflection->GetRepeatedEnum(message, field, j)->number());
        }
      } else {
        data_size += WireFormatLite::EnumSize(
          message_reflection->GetEnum(message, field)->number());
      }
      break;
    }

    // Handle strings separately so that we can get string references
    // instead of copying.
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_BYTES: {
      for (int j = 0; j < count; j++) {
        string scratch;
        const string& value = field->is_repeated() ?
          message_reflection->GetRepeatedStringReference(
            message, field, j, &scratch) :
          message_reflection->GetStringReference(message, field, &scratch);
        data_size += WireFormatLite::StringSize(value);
      }
      break;
    }
  }
  return data_size;
}